

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_error.hpp
# Opt level: O1

void __thiscall
tao::pegtl::parse_error::
parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
          (parse_error *this,string *msg,
          action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *in)

{
  pointer pcVar1;
  undefined1 local_50 [24];
  _Alloc_hider local_38;
  char local_28 [16];
  
  local_50._0_8_ = (in->m_begin).byte;
  local_50._8_8_ = (in->m_begin).line;
  local_50._16_8_ = (in->m_begin).byte_in_line;
  pcVar1 = (in->m_input->
           super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).m_source._M_dataplus._M_p;
  local_38._M_p = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,
             pcVar1 + (in->m_input->
                      super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_source._M_string_length);
  parse_error(this,msg,(position *)local_50);
  if (local_38._M_p != local_28) {
    operator_delete(local_38._M_p);
  }
  return;
}

Assistant:

parse_error( const std::string& msg, const Input& in )
            : parse_error( msg, in.position() )
         {
         }